

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O2

void __thiscall
glslang::TIntermediate::checkCallGraphBodies
          (TIntermediate *this,TInfoSink *infoSink,bool keepUncalled)

{
  TGraph *pTVar1;
  pointer ppTVar2;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  __last;
  TIntermediate *pTVar3;
  TInfoSink *infoSink_00;
  bool bVar4;
  int iVar5;
  _List_node_base *p_Var6;
  undefined4 extraout_var;
  vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *this_00;
  long *plVar7;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar8;
  undefined4 extraout_var_01;
  TString *deadCaller;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  _Var9;
  undefined7 in_register_00000011;
  bool bVar10;
  int f;
  size_type sVar11;
  int f_1;
  _List_node_base *p_Var12;
  reference rVar13;
  allocator_type local_79;
  TIntermediate *local_78;
  undefined4 local_6c;
  TInfoSink *local_68;
  bool local_60 [8];
  vector<bool,_std::allocator<bool>_> reachable;
  undefined4 extraout_var_00;
  
  local_6c = (undefined4)CONCAT71(in_register_00000011,keepUncalled);
  pTVar1 = &this->callGraph;
  p_Var6 = (_List_node_base *)pTVar1;
  while (p_Var6 = (((_List_base<glslang::TCall,_std::allocator<glslang::TCall>_> *)&p_Var6->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != (_List_node_base *)pTVar1) {
    *(undefined1 *)&p_Var6[6]._M_next = 0;
    *(undefined4 *)((long)&p_Var6[6]._M_next + 4) = 0xffffffff;
  }
  local_78 = this;
  local_68 = infoSink;
  iVar5 = (*this->treeRoot->_vptr_TIntermNode[6])();
  this_00 = (vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_> *)
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar5) + 400))
                      ((long *)CONCAT44(extraout_var,iVar5));
  local_60[0] = true;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&reachable,
             (long)(this_00->
                   super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this_00->
                   super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 3,local_60,&local_79);
  for (sVar11 = 0; pTVar3 = local_78,
      ppTVar2 = (this_00->super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                )._M_impl.super__Vector_impl_data._M_start, p_Var6 = (_List_node_base *)pTVar1,
      (long)sVar11 <
      (long)(int)((ulong)((long)(this_00->
                                super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar2) >> 3);
      sVar11 = sVar11 + 1) {
    iVar5 = (*ppTVar2[sVar11]->_vptr_TIntermNode[6])();
    plVar7 = (long *)CONCAT44(extraout_var_00,iVar5);
    if ((plVar7 != (long *)0x0) && ((int)plVar7[0x17] == 5)) {
      pbVar8 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
               (**(code **)(*plVar7 + 0x1a8))(plVar7);
      iVar5 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (pbVar8,(local_78->entryPointMangledName)._M_dataplus._M_p);
      if (iVar5 != 0) {
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&reachable,sVar11);
        *rVar13._M_p = *rVar13._M_p & ~rVar13._M_mask;
      }
      while (p_Var6 = (((_List_base<glslang::TCall,_std::allocator<glslang::TCall>_> *)
                       &p_Var6->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var6 != (_List_node_base *)pTVar1) {
        pbVar8 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 (**(code **)(*plVar7 + 0x1a8))(plVar7);
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)&p_Var6[3]._M_prev,pbVar8);
        if (bVar4) {
          *(int *)((long)&p_Var6[6]._M_next + 4) = (int)sVar11;
        }
      }
    }
  }
  while (p_Var6 = (((_List_base<glslang::TCall,_std::allocator<glslang::TCall>_> *)&p_Var6->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != (_List_node_base *)pTVar1) {
    iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (p_Var6 + 1),(pTVar3->entryPointMangledName)._M_dataplus._M_p);
    if (iVar5 == 0) {
      *(undefined1 *)&p_Var6[6]._M_next = 1;
    }
  }
  p_Var6 = (_List_node_base *)pTVar1;
  bVar4 = false;
  do {
    while (bVar10 = bVar4, infoSink_00 = local_68,
          p_Var6 = (((_List_base<glslang::TCall,_std::allocator<glslang::TCall>_> *)&p_Var6->_M_next
                    )->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var6 != (_List_node_base *)pTVar1) {
      bVar4 = bVar10;
      if (*(char *)&p_Var6[6]._M_next == '\x01') {
        p_Var12 = (_List_node_base *)pTVar1;
        while (p_Var12 = (((_List_base<glslang::TCall,_std::allocator<glslang::TCall>_> *)
                          &p_Var12->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              bVar4 = bVar10, p_Var12 != (_List_node_base *)pTVar1) {
          if ((*(char *)&p_Var12[6]._M_next == '\0') &&
             (bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                       *)&p_Var6[3]._M_prev,
                                      (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                       *)(p_Var12 + 1)), bVar4)) {
            *(undefined1 *)&p_Var12[6]._M_next = 1;
            bVar10 = true;
          }
        }
      }
    }
    p_Var6 = (_List_node_base *)pTVar1;
    bVar4 = false;
  } while (bVar10);
  while (pTVar3 = local_78,
        p_Var6 = (((_List_base<glslang::TCall,_std::allocator<glslang::TCall>_> *)&p_Var6->_M_next)
                 ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var6 != (_List_node_base *)pTVar1) {
    if (*(char *)&p_Var6[6]._M_next == '\x01') {
      sVar11 = (size_type)*(int *)((long)&p_Var6[6]._M_next + 4);
      if (sVar11 == 0xffffffffffffffff) {
        error(local_78,infoSink_00,"No function definition (body) found: ",EShLangCount);
        TInfoSinkBase::append(&infoSink_00->info,"    ");
        TInfoSinkBase::append(&infoSink_00->info,(TString *)&p_Var6[3]._M_prev);
        TInfoSinkBase::append(&infoSink_00->info,"\n");
      }
      else {
        rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&reachable,sVar11);
        *rVar13._M_p = *rVar13._M_p | rVar13._M_mask;
      }
    }
  }
  if ((char)local_6c == '\0') {
    sVar11 = 0;
    while( true ) {
      _Var9._M_current =
           (this_00->super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
           _M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (this_00->super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if ((long)(int)((ulong)((long)__last._M_current - (long)_Var9._M_current) >> 3) <=
          (long)sVar11) break;
      rVar13 = std::vector<bool,_std::allocator<bool>_>::operator[](&reachable,sVar11);
      if ((*rVar13._M_p & rVar13._M_mask) == 0) {
        iVar5 = (*(this_00->
                  super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[sVar11]->_vptr_TIntermNode[6])();
        deadCaller = (TString *)
                     (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x1a8))
                               ((long *)CONCAT44(extraout_var_01,iVar5));
        resetTopLevelUncalledStatus(pTVar3,deadCaller);
        (this_00->super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>).
        _M_impl.super__Vector_impl_data._M_start[sVar11] = (TIntermNode *)0x0;
      }
      sVar11 = sVar11 + 1;
    }
    local_60[0] = false;
    local_60[1] = false;
    local_60[2] = false;
    local_60[3] = false;
    local_60[4] = false;
    local_60[5] = false;
    local_60[6] = false;
    local_60[7] = false;
    _Var9 = std::
            __remove_if<__gnu_cxx::__normal_iterator<TIntermNode**,std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<decltype(nullptr)const>>
                      (_Var9,__last,(_Iter_equals_val<const_std::nullptr_t>)local_60);
    std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>::erase
              (this_00,(const_iterator)_Var9._M_current,
               (const_iterator)
               (this_00->super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>)
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&reachable.super__Bvector_base<std::allocator<bool>_>);
  return;
}

Assistant:

void TIntermediate::checkCallGraphBodies(TInfoSink& infoSink, bool keepUncalled)
{
    // Clear fields we'll use for this.
    for (TGraph::iterator call = callGraph.begin(); call != callGraph.end(); ++call) {
        call->visited = false;
        call->calleeBodyPosition = -1;
    }

    // The top level of the AST includes function definitions (bodies).
    // Compare these to function calls in the call graph.
    // We'll end up knowing which have bodies, and if so,
    // how to map the call-graph node to the location in the AST.
    TIntermSequence &functionSequence = getTreeRoot()->getAsAggregate()->getSequence();
    std::vector<bool> reachable(functionSequence.size(), true); // so that non-functions are reachable
    for (int f = 0; f < (int)functionSequence.size(); ++f) {
        glslang::TIntermAggregate* node = functionSequence[f]->getAsAggregate();
        if (node && (node->getOp() == glslang::EOpFunction)) {
            if (node->getName().compare(getEntryPointMangledName().c_str()) != 0)
                reachable[f] = false; // so that function bodies are unreachable, until proven otherwise
            for (TGraph::iterator call = callGraph.begin(); call != callGraph.end(); ++call) {
                if (call->callee == node->getName())
                    call->calleeBodyPosition = f;
            }
        }
    }

    // Start call-graph traversal by visiting the entry point nodes.
    for (TGraph::iterator call = callGraph.begin(); call != callGraph.end(); ++call) {
        if (call->caller.compare(getEntryPointMangledName().c_str()) == 0)
            call->visited = true;
    }

    // Propagate 'visited' through the call-graph to every part of the graph it
    // can reach (seeded with the entry-point setting above).
    bool changed;
    do {
        changed = false;
        for (auto call1 = callGraph.begin(); call1 != callGraph.end(); ++call1) {
            if (call1->visited) {
                for (TGraph::iterator call2 = callGraph.begin(); call2 != callGraph.end(); ++call2) {
                    if (! call2->visited) {
                        if (call1->callee == call2->caller) {
                            changed = true;
                            call2->visited = true;
                        }
                    }
                }
            }
        }
    } while (changed);

    // Any call-graph node set to visited but without a callee body is an error.
    for (TGraph::iterator call = callGraph.begin(); call != callGraph.end(); ++call) {
        if (call->visited) {
            if (call->calleeBodyPosition == -1) {
                error(infoSink, "No function definition (body) found: ");
                infoSink.info << "    " << call->callee << "\n";
            } else
                reachable[call->calleeBodyPosition] = true;
        }
    }

    // Bodies in the AST not reached by the call graph are dead;
    // clear them out, since they can't be reached and also can't
    // be translated further due to possibility of being ill defined.
    if (! keepUncalled) {
        for (int f = 0; f < (int)functionSequence.size(); ++f) {
            if (! reachable[f])
            {
                resetTopLevelUncalledStatus(functionSequence[f]->getAsAggregate()->getName());
                functionSequence[f] = nullptr;
            }
        }
        functionSequence.erase(std::remove(functionSequence.begin(), functionSequence.end(), nullptr), functionSequence.end());
    }
}